

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

SourceBase * __thiscall
COLLADASaxFWL::MeshLoader::getSourceByInputSemanticFromVertices(MeshLoader *this,Semantic *semantic)

{
  InputUnshared *this_00;
  String *pSVar1;
  String *in_RDI;
  String sourceId;
  URI positionsInputSource;
  InputUnshared *positionsInput;
  Semantic *in_stack_fffffffffffffea8;
  MeshLoader *in_stack_fffffffffffffeb0;
  URI *this_01;
  SourceArrayLoader *in_stack_fffffffffffffec8;
  string local_128 [95];
  undefined1 in_stack_ffffffffffffff37;
  URI *in_stack_ffffffffffffff38;
  URI *in_stack_ffffffffffffff40;
  SourceBase *local_8;
  
  this_00 = getVertexInputBySemantic(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (this_00 == (InputUnshared *)0x0) {
    local_8 = (SourceBase *)0x0;
  }
  else {
    InputUnshared::getSource(this_00);
    this_01 = (URI *)(local_128 + 0x20);
    COLLADABU::URI::URI(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        (bool)in_stack_ffffffffffffff37);
    pSVar1 = COLLADABU::URI::getFragment_abi_cxx11_(this_01);
    std::__cxx11::string::string(local_128,(string *)pSVar1);
    local_8 = SourceArrayLoader::getSourceById(in_stack_fffffffffffffec8,in_RDI);
    std::__cxx11::string::~string(local_128);
    COLLADABU::URI::~URI(this_01);
  }
  return local_8;
}

Assistant:

const SourceBase* MeshLoader::getSourceByInputSemanticFromVertices ( const InputSemantic::Semantic& semantic ) const
    {
        // Check if the input element with the semantic is a vertex element.
        const InputUnshared* positionsInput = getVertexInputBySemantic ( semantic );
        if ( positionsInput == 0 ) return 0;

        // Get the source element with the uri of the input element.
        COLLADABU::URI positionsInputSource = positionsInput->getSource ();
        String sourceId = positionsInputSource.getFragment ();

        return getSourceById ( sourceId );
    }